

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

bool __thiscall V1Transport::ReceivedBytes(V1Transport *this,Span<const_unsigned_char> *msg_bytes)

{
  uint uVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_recv_mutex,"m_recv_mutex"
             ,"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h",0x1ab
             ,false);
  if (this->in_data == true) {
    uVar1 = readData(this,*msg_bytes);
  }
  else {
    uVar1 = readHeader(this,*msg_bytes);
  }
  if ((int)uVar1 < 0) {
    Reset(this);
  }
  else {
    msg_bytes->m_data = msg_bytes->m_data + uVar1;
    msg_bytes->m_size = msg_bytes->m_size - (ulong)uVar1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return -1 < (int)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_recv_mutex)
    {
        AssertLockNotHeld(m_recv_mutex);
        LOCK(m_recv_mutex);
        int ret = in_data ? readData(msg_bytes) : readHeader(msg_bytes);
        if (ret < 0) {
            Reset();
        } else {
            msg_bytes = msg_bytes.subspan(ret);
        }
        return ret >= 0;
    }